

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined8 in_RAX;
  ulong uVar8;
  nn_trie_node **self_00;
  nn_trie_node *pnVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long *plVar13;
  long lVar14;
  nn_trie_node *pnVar15;
  byte *pbVar16;
  ulong uVar17;
  int local_34;
  
  pnVar9 = *self;
  if (size != 0) {
    bVar4 = pnVar9->prefix_len;
    uVar17 = (ulong)bVar4;
    uVar8 = 0;
    if (bVar4 == 0) {
LAB_00125abf:
      if ((uint)uVar8 != (uint)bVar4) {
        return 0;
      }
      uVar17 = (ulong)(uint)bVar4;
    }
    else {
      uVar8 = 0;
      do {
        if (size == uVar8) {
          uVar8 = size & 0xffffffff;
          goto LAB_00125abf;
        }
        if (pnVar9->prefix[uVar8] != data[uVar8]) goto LAB_00125abf;
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
    }
    if (uVar17 != size) {
      pbVar16 = data + uVar17;
      self_00 = nn_node_next(pnVar9,*pbVar16);
      if (self_00 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar6 = nn_node_unsubscribe(self_00,pbVar16 + 1,~uVar17 + size);
      if (iVar6 == 0) {
        return 0;
      }
      if (*self_00 != (nn_trie_node *)0x0) {
        return 1;
      }
      pnVar9 = *self;
      uVar8 = (ulong)pnVar9->type;
      if (uVar8 < 9) {
        if (uVar8 != 0) {
          uVar17 = 0;
          do {
            if (pnVar9->prefix[uVar17 + 10] == *pbVar16) {
              memmove(pnVar9->prefix + uVar17 + 10,pnVar9->prefix + uVar17 + 0xb,~uVar17 + uVar8);
              pnVar9 = *self;
              memmove(pnVar9[1].prefix + uVar17 * 8 + -6,pnVar9[1].prefix + uVar17 * 8 + 2,
                      (long)(int)(~(uint)uVar17 + (uint)pnVar9->type) << 3);
              pnVar9 = *self;
              bVar4 = pnVar9->type - 1;
              pnVar9->type = bVar4;
              pnVar9 = (nn_trie_node *)nn_realloc(pnVar9,(ulong)bVar4 * 8 + 0x18);
              *self = pnVar9;
              if (pnVar9 == (nn_trie_node *)0x0) {
                __assert_fail("*self",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                              ,0x21e,
                              "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)"
                             );
              }
              if ((pnVar9->type == '\0') && (pnVar9->refcount == 0)) {
                nn_free(pnVar9);
                *self = (nn_trie_node *)0x0;
                return 1;
              }
              pnVar9 = nn_node_compact(pnVar9);
              *self = pnVar9;
              return 1;
            }
            uVar17 = uVar17 + 1;
          } while (uVar8 != uVar17);
        }
        __assert_fail("index != (*self)->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x210,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      uVar3 = (pnVar9->u).dense.nbr;
      if (uVar3 < 10) {
        pnVar9 = (nn_trie_node *)nn_alloc_(0x58);
        if (pnVar9 == (nn_trie_node *)0x0) {
          __assert_fail("new_node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x260,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        pnVar9->refcount = 0;
        pnVar15 = *self;
        bVar4 = pnVar15->prefix_len;
        pnVar9->prefix_len = bVar4;
        memcpy(pnVar9->prefix,pnVar15->prefix,(ulong)bVar4);
        pnVar9->type = '\b';
        pnVar15 = *self;
        bVar4 = (pnVar15->u).sparse.children[0];
        uVar12 = (uint)bVar4;
        if ((pnVar15->u).sparse.children[1] + 1 != (uint)bVar4) {
          uVar8 = 0;
          iVar6 = 0;
          do {
            lVar14 = *(long *)(pnVar15[1].prefix + uVar8 * 8 + -6);
            if (lVar14 != 0) {
              pnVar9->prefix[(long)iVar6 + 10] = (char)uVar12 + (char)uVar8;
              *(long *)(pnVar9[1].prefix + (long)iVar6 * 8 + -6) = lVar14;
              iVar6 = iVar6 + 1;
              pnVar15 = *self;
            }
            uVar8 = uVar8 + 1;
            uVar12 = (uint)(pnVar15->u).sparse.children[0];
          } while (uVar8 != ((pnVar15->u).sparse.children[1] - uVar12) + 1);
          if (iVar6 == 8) {
            nn_free(pnVar15);
            *self = pnVar9;
            return 1;
          }
        }
        __assert_fail("j == NN_TRIE_SPARSE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x26f,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      bVar4 = *pbVar16;
      bVar2 = (pnVar9->u).sparse.children[0];
      uVar12 = (uint)bVar2;
      if (bVar4 != bVar2) {
        if (bVar4 != (pnVar9->u).sparse.children[1]) {
          (pnVar9->u).dense.nbr = uVar3 - 1;
          return 1;
        }
        uVar8 = (ulong)uVar12;
        plVar13 = (long *)((long)pnVar9 + ((ulong)bVar4 * 8 - (ulong)((uint)bVar2 * 8)) + 0x18);
        do {
          if (*plVar13 != 0) {
            cVar5 = bVar4 - (char)uVar8;
            goto LAB_00125dcd;
          }
          uVar8 = uVar8 + 1;
          plVar13 = plVar13 + -1;
        } while (bVar4 != uVar8);
        cVar5 = '\0';
LAB_00125dcd:
        (pnVar9->u).sparse.children[1] = bVar2 + cVar5;
        puVar1 = &((*self)->u).dense.nbr;
        *puVar1 = *puVar1 - 1;
        pnVar9 = *self;
        pnVar9 = (nn_trie_node *)
                 nn_realloc(pnVar9,((ulong)(pnVar9->u).sparse.children[1] -
                                   (ulong)(pnVar9->u).sparse.children[0]) * 8 + 0x20);
        *self = pnVar9;
        if (pnVar9 != (nn_trie_node *)0x0) {
          return 1;
        }
        __assert_fail("*self",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x253,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      pnVar15 = pnVar9 + 1;
      uVar7 = (uint)(pnVar9->u).sparse.children[1];
      uVar10 = uVar7 - uVar12;
      if (uVar10 == 0xffffffff) {
        uVar11 = 0;
      }
      else {
        uVar11 = uVar10 + 1;
        lVar14 = 0;
        do {
          if (*(long *)(pnVar15->prefix + lVar14 * 8 + -6) != 0) {
            uVar11 = (uint)lVar14;
            break;
          }
          lVar14 = lVar14 + 1;
        } while ((ulong)uVar10 + 1 != lVar14);
      }
      iVar6 = uVar12 + uVar11;
      memmove(pnVar15,pnVar15->prefix + (ulong)uVar11 * 8 + -6,(long)(int)((uVar7 - iVar6) + 1) << 3
             );
      ((*self)->u).sparse.children[0] = (uint8_t)iVar6;
      puVar1 = &((*self)->u).dense.nbr;
      *puVar1 = *puVar1 - 1;
      pnVar9 = (nn_trie_node *)
               nn_realloc(*self,(long)(int)(((uint)((*self)->u).sparse.children[1] - iVar6) + 1) * 8
                                + 0x18);
      *self = pnVar9;
      if (pnVar9 != (nn_trie_node *)0x0) {
        return 1;
      }
      __assert_fail("*self",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                    ,0x244,
                    "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
    }
  }
  if (pnVar9 == (nn_trie_node *)0x0) {
    local_34 = -0x16;
  }
  else {
    nn_node_unsubscribe_cold_1();
    local_34 = (int)((ulong)in_RAX >> 0x20);
  }
  return local_34;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}